

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void AddVarsToScope(ParseNode *vars,ByteCodeGenerator *byteCodeGenerator)

{
  Type *pTVar1;
  byte bVar2;
  IdentPtr pIVar3;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  bool bVar4;
  Symbol *this_00;
  ParseNodeVar *pPVar5;
  char16 *pcVar6;
  Type *ppFVar7;
  FunctionBody *pFVar8;
  int in_ECX;
  char16 *key;
  ByteCodeGenerator *this_01;
  Type this_02;
  
  if (vars != (ParseNode *)0x0) {
    do {
      ParseNode::AsParseNodeVar(vars);
      this_01 = (ByteCodeGenerator *)vars;
      ParseNode::AsParseNodeVar(vars);
      this_00 = ByteCodeGenerator::AddSymbolToScope
                          (this_01,byteCodeGenerator->currentScope->func->bodyScope,key,in_ECX,vars,
                           STFunction);
      if ((this_00->symbolType == STVariable) &&
         (bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase), bVar4)) {
        pPVar5 = ParseNode::AsParseNodeVar(vars);
        pIVar3 = pPVar5->pid;
        pcVar6 = Symbol::GetSymbolTypeName(this_00);
        Output::Print(L"current context has declared var %s of type %s\n",&pIVar3->field_0x22,pcVar6
                     );
      }
      bVar4 = Symbol::IsArguments(this_00);
      if (((bVar4) || (bVar4 = Symbol::IsSpecialSymbol(this_00), bVar4)) ||
         (pPVar5 = ParseNode::AsParseNodeVar(vars), pPVar5->pnodeInit == (ParseNodePtr)0x0)) {
        pPVar5 = ParseNode::AsParseNodeVar(vars);
        pPVar5->sym = this_00;
        bVar4 = Symbol::IsArguments(this_00);
        if (bVar4) {
          ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                              (&byteCodeGenerator->funcInfoStack->
                                super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
          FuncInfo::SetArgumentsSymbol(*ppFVar7,this_00);
        }
        else {
          bVar4 = Symbol::IsSpecialSymbol(this_00);
          if (bVar4) {
            this = byteCodeGenerator->funcInfoStack;
            if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
                (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
              this_02 = (FuncInfo *)0x0;
            }
            else {
              ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                                  (&this->
                                    super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
              this_02 = *ppFVar7;
            }
            bVar2 = this_00->field_0x44;
            if ((bVar2 & 2) == 0) {
              if ((bVar2 & 4) == 0) {
                if ((bVar2 & 0x20) == 0) {
                  if ((bVar2 & 8) == 0) {
                    if ((bVar2 & 0x10) != 0) {
                      FuncInfo::SetSuperConstructorSymbol(this_02,this_00);
                    }
                  }
                  else {
                    FuncInfo::SetSuperSymbol(this_02,this_00);
                  }
                }
                else {
                  FuncInfo::SetImportMetaSymbol(this_02,this_00);
                }
              }
              else {
                FuncInfo::SetNewTargetSymbol(this_02,this_00);
              }
            }
            else {
              FuncInfo::SetThisSymbol(this_02,this_00);
              pFVar8 = FuncInfo::GetParsedFunctionBody(this_02);
              pTVar1 = &(pFVar8->super_ParseableFunctionInfo).flags;
              *pTVar1 = *pTVar1 | Flags_HasThis;
            }
          }
        }
      }
      else {
        pPVar5 = ParseNode::AsParseNodeVar(vars);
        pPVar5->sym = (Symbol *)0x0;
      }
      pPVar5 = ParseNode::AsParseNodeVar(vars);
      vars = pPVar5->pnodeNext;
    } while ((ByteCodeGenerator *)vars != (ByteCodeGenerator *)0x0);
  }
  return;
}

Assistant:

void AddVarsToScope(ParseNode *vars, ByteCodeGenerator *byteCodeGenerator)
{
    while (vars != nullptr)
    {
        Symbol *sym = byteCodeGenerator->AddSymbolToFunctionScope(reinterpret_cast<const char16*>(vars->AsParseNodeVar()->pid->Psz()), vars->AsParseNodeVar()->pid->Cch(), vars, STVariable);

#if DBG_DUMP
        if (sym->GetSymbolType() == STVariable && byteCodeGenerator->Trace())
        {
            Output::Print(_u("current context has declared var %s of type %s\n"),
                vars->AsParseNodeVar()->pid->Psz(), sym->GetSymbolTypeName());
        }
#endif

        if (sym->IsArguments() || sym->IsSpecialSymbol() || vars->AsParseNodeVar()->pnodeInit == nullptr)
        {
            // LHS's of var decls are usually bound to symbols later, during the Visit/Bind pass,
            // so that things like catch scopes can be taken into account.
            // The exception is "arguments", which always binds to the local scope.
            // We can also bind to the function scope symbol now if there's no init value
            // to assign.
            vars->AsParseNodeVar()->sym = sym;
            if (sym->IsArguments())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();
                funcInfo->SetArgumentsSymbol(sym);
            }
            else if (sym->IsSpecialSymbol())
            {
                FuncInfo* funcInfo = byteCodeGenerator->TopFuncInfo();

                if (sym->IsThis())
                {
                    funcInfo->SetThisSymbol(sym);
                    funcInfo->GetParsedFunctionBody()->SetHasThis(true);
                }
                else if (sym->IsNewTarget())
                {
                    funcInfo->SetNewTargetSymbol(sym);
                }
                else if (sym->IsImportMeta())
                {
                    funcInfo->SetImportMetaSymbol(sym);
                }
                else if (sym->IsSuper())
                {
                    funcInfo->SetSuperSymbol(sym);
                }
                else if (sym->IsSuperConstructor())
                {
                    funcInfo->SetSuperConstructorSymbol(sym);
                }
            }
        }
        else
        {
            vars->AsParseNodeVar()->sym = nullptr;
        }
        vars = vars->AsParseNodeVar()->pnodeNext;
    }
}